

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

int solver2_analyze_final(sat_solver2 *s,clause *conf,int skip_first)

{
  clause *cls;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  clause *pcVar4;
  long lVar5;
  long lVar6;
  
  veci_resize(&s->conf_final,0);
  if (s->root_level == 0) {
    return s->hProofLast;
  }
  pcVar4 = conf;
  proof_chain_start(s,conf);
  if ((s->tagged).size == 0) {
    for (lVar5 = (long)skip_first;
        (lVar5 < (long)(ulong)((uint)*conf >> 0xb) && (1 < (uint)conf[lVar5 + 1]));
        lVar5 = lVar5 + 1) {
      uVar1 = (int)conf[lVar5 + 1] >> 1;
      if (s->levels[(int)uVar1] == 0) {
        pcVar4 = (clause *)0x0;
        proof_chain_resolve(s,(clause *)0x0,uVar1);
      }
      else {
        pcVar4 = (clause *)(ulong)uVar1;
        var_set_tag(s,uVar1,uVar1);
      }
    }
    if ((s->trail_lim).size <= s->root_level) {
      lVar5 = (long)s->qtail;
      while( true ) {
        while( true ) {
          do {
            lVar6 = lVar5;
            if (lVar6 <= *(s->trail_lim).ptr) {
              solver2_clear_tags(s,(int)pcVar4);
              iVar2 = proof_chain_stop(s);
              return iVar2;
            }
            lVar5 = lVar6 + -1;
            iVar2 = s->trail[lVar6 + -1] >> 1;
          } while (((uint)s->vi[iVar2] & 0x3c) == 0);
          cls = Sat_MemClauseHand(&s->Mem,s->reasons[iVar2]);
          if (cls == (clause *)0x0) break;
          pcVar4 = cls;
          proof_chain_resolve(s,cls,iVar2);
          for (uVar3 = 1;
              (uVar3 < (uint)*cls >> 0xb &&
              (uVar1 = (int)cls[uVar3 + 1] >> 1, 1 < (uint)cls[uVar3 + 1])); uVar3 = uVar3 + 1) {
            if (s->levels[(int)uVar1] == 0) {
              pcVar4 = (clause *)0x0;
              proof_chain_resolve(s,(clause *)0x0,uVar1);
            }
            else {
              pcVar4 = (clause *)(ulong)uVar1;
              var_set_tag(s,uVar1,uVar1);
            }
          }
        }
        if (s->levels[iVar2] == 0) break;
        uVar1 = s->trail[lVar6 + -1] ^ 1;
        pcVar4 = (clause *)(ulong)uVar1;
        veci_push(&s->conf_final,uVar1);
      }
      __assert_fail("var_level(s,x)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x287,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
    }
    __assert_fail("s->root_level >= veci_size(&s->trail_lim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x278,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
  }
  __assert_fail("veci_size(&s->tagged) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                ,0x271,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
}

Assistant:

static int solver2_analyze_final(sat_solver2* s, clause* conf, int skip_first)
{
    int i, j, x;//, start;
    veci_resize(&s->conf_final,0);
    if ( s->root_level == 0 )
        return s->hProofLast;
    proof_chain_start( s, conf );
    assert( veci_size(&s->tagged) == 0 );
    clause_foreach_var( conf, x, i, skip_first ){
        if ( var_level(s,x) )
            var_set_tag(s, x, 1);
        else
            proof_chain_resolve( s, NULL, x );
    }
    assert( s->root_level >= veci_size(&s->trail_lim) );
//    start = (s->root_level >= veci_size(&s->trail_lim))? s->qtail-1 : (veci_begin(&s->trail_lim))[s->root_level];
    for (i = s->qtail-1; i >= (veci_begin(&s->trail_lim))[0]; i--){
        x = lit_var(s->trail[i]);
        if (var_tag(s,x)){
            clause* c = clause2_read(s, var_reason(s,x));
            if (c){
                proof_chain_resolve( s, c, x );
                clause_foreach_var( c, x, j, 1 ){
                    if ( var_level(s,x) )
                        var_set_tag(s, x, 1);
                    else
                        proof_chain_resolve( s, NULL, x );
                }
            }else {
                assert( var_level(s,x) );
                veci_push(&s->conf_final,lit_neg(s->trail[i]));
            }
        }
    }
    solver2_clear_tags(s,0);
    return proof_chain_stop( s );
}